

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack8_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0xff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 8 & 0xff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x10 & 0xff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 0x18;
  puVar2 = in + 1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 & 0xff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 8 & 0xff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x10 & 0xff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x18;
  *puVar1 = base + *puVar1;
  return in + 2;
}

Assistant:

uint32_t * unpack8_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;
    *out = ( (*in) >>  0  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  16  )   % (1U << 8 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out += base;
    out++;

    return in;
}